

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void x86_cpu_do_interrupt_x86_64(CPUState *cs)

{
  int intno;
  
  intno = cs->exception_index;
  if (intno < 0x100) {
    do_interrupt_all((X86CPU *)cs,intno,*(int *)((long)cs[1].tb_jmp_cache + 0x1c44),
                     *(int *)(cs[1].tb_jmp_cache + 0x388),(target_ulong)cs[1].tb_jmp_cache[0x389],0)
    ;
    *(undefined4 *)(cs[1].tb_jmp_cache + 0x396) = 0xffffffff;
    return;
  }
  if (*(int *)(cs[1].tb_jmp_cache + 0x396) == -1) {
    do_vmexit_x86_64((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb),intno - 0x100,
                     (long)*(int *)(cs[1].tb_jmp_cache + 0x388));
    return;
  }
  __assert_fail("env->old_exception == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/seg_helper.c"
                ,0x4b1,"void x86_cpu_do_interrupt_x86_64(CPUState *)");
}

Assistant:

void x86_cpu_do_interrupt(CPUState *cs)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;

    if (cs->exception_index >= EXCP_VMEXIT) {
        assert(env->old_exception == -1);
        do_vmexit(env, cs->exception_index - EXCP_VMEXIT, env->error_code);
    } else {
        do_interrupt_all(cpu, cs->exception_index,
                         env->exception_is_int,
                         env->error_code,
                         env->exception_next_eip, 0);
        /* successfully delivered */
        env->old_exception = -1;
    }
}